

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCoordinator.cpp
# Opt level: O0

void __thiscall
helics::TimeCoordinator::setProperty(TimeCoordinator *this,int intProperty,int propertyVal)

{
  Time propertyVal_00;
  undefined4 in_EDX;
  int in_ESI;
  TimeRepresentation<count_time<9,_long>_> *in_RDI;
  undefined4 in_stack_ffffffffffffffd8;
  TimeCoordinator *in_stack_ffffffffffffffe8;
  
  if (in_ESI == 0x103) {
    *(undefined4 *)((long)&in_RDI[0x4a].internalTimeCode + 4) = in_EDX;
  }
  else {
    TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
              (in_RDI,(double)CONCAT44(in_ESI,in_stack_ffffffffffffffd8));
    propertyVal_00.internalTimeCode._4_4_ = in_ESI;
    propertyVal_00.internalTimeCode._0_4_ = in_EDX;
    setProperty(in_stack_ffffffffffffffe8,(int)((ulong)in_RDI >> 0x20),propertyVal_00);
  }
  return;
}

Assistant:

void TimeCoordinator::setProperty(int intProperty, int propertyVal)
{
    if (intProperty == defs::Properties::MAX_ITERATIONS) {
        info.maxIterations = propertyVal;
    } else {
        setProperty(intProperty, Time(static_cast<double>(propertyVal)));
    }
}